

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O0

int __thiscall
jaegertracing::net::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  runtime_error *this_00;
  undefined4 in_register_00000034;
  string local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  addrinfo *paStack_48;
  int returnCode;
  addrinfo *itr;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> result;
  URI *serverURI_local;
  Socket *this_local;
  
  iVar1._0_2_ = __addr[4].sa_family;
  iVar1._2_1_ = __addr[4].sa_data[0];
  iVar1._3_1_ = __addr[4].sa_data[1];
  result._M_t.super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
  super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
  super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl = (addrinfo *)__addr;
  jaegertracing::net::resolveAddress((string *)&itr,(int)__addr + 0x20,iVar1,2);
  paStack_48 = std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::get
                         ((unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *)&itr);
  while( true ) {
    if (paStack_48 == (pointer)0x0) {
      std::__cxx11::ostringstream::ostringstream(local_1d8);
      std::operator<<((ostream *)local_1d8,"Cannot connect socket to remote address ");
      URI::print<std::__cxx11::ostringstream>
                ((URI *)result._M_t.
                        super___uniq_ptr_impl<addrinfo,_jaegertracing::net::AddrInfoDeleter>._M_t.
                        super__Tuple_impl<0UL,_addrinfo_*,_jaegertracing::net::AddrInfoDeleter>.
                        super__Head_base<0UL,_addrinfo_*,_false>._M_head_impl,
                 (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1d8);
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(this_00,local_1f8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = ::connect(*(int *)(CONCAT44(in_register_00000034,__fd) + 4),
                      (sockaddr *)paStack_48->ai_addr,paStack_48->ai_addrlen);
    if (iVar1 == 0) break;
    paStack_48 = paStack_48->ai_next;
  }
  IPAddress::IPAddress((IPAddress *)this,paStack_48->ai_addr,paStack_48->ai_addrlen);
  std::unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter>::~unique_ptr
            ((unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *)&itr);
  return (int)this;
}

Assistant:

IPAddress connect(const URI& serverURI)
    {
        auto result =
            resolveAddress(serverURI._host, serverURI._port, AF_INET, _type);
        for (const auto* itr = result.get(); itr; itr = itr->ai_next) {
            const auto returnCode =
                ::connect(_handle, itr->ai_addr, itr->ai_addrlen);
            if (returnCode == 0) {
                return IPAddress(*itr->ai_addr, itr->ai_addrlen);
            }
        }
        std::ostringstream oss;
        oss << "Cannot connect socket to remote address ";
        serverURI.print(oss);
        throw std::runtime_error(oss.str());
    }